

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O0

Emissive * __thiscall pm::World::createMaterial<pm::Emissive>(World *this)

{
  reference this_00;
  Emissive *pEVar1;
  unique_ptr<pm::Emissive,_std::default_delete<pm::Emissive>_> local_20;
  unique_ptr<pm::Material,_std::default_delete<pm::Material>_> local_18;
  World *local_10;
  World *this_local;
  
  local_10 = this;
  std::make_unique<pm::Emissive>();
  std::unique_ptr<pm::Material,std::default_delete<pm::Material>>::
  unique_ptr<pm::Emissive,std::default_delete<pm::Emissive>,void>
            ((unique_ptr<pm::Material,std::default_delete<pm::Material>> *)&local_18,&local_20);
  std::
  vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ::push_back(&this->materials_,(value_type *)&local_18);
  std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::~unique_ptr(&local_18);
  std::unique_ptr<pm::Emissive,_std::default_delete<pm::Emissive>_>::~unique_ptr(&local_20);
  this_00 = std::
            vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
            ::back(&this->materials_);
  pEVar1 = (Emissive *)
           std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::get(this_00);
  return pEVar1;
}

Assistant:

T *World::createMaterial(Args &&... args)
{
	materials_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
	return static_cast<T *>(materials_.back().get());
}